

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O0

View * __thiscall r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input)

{
  bool bVar1;
  SyncMode SVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  reference ppGVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Controller *c;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar8;
  HASTController *this_00;
  undefined4 extraout_var_03;
  Code *pCVar9;
  undefined4 extraout_var_04;
  uint64_t uVar10;
  uint64_t uVar11;
  size_type sVar12;
  View *pVVar13;
  Atom *pAVar14;
  _Mem *p_Var15;
  size_t s;
  float fVar16;
  string local_f8 [8];
  string type;
  Atom local_d8 [4];
  Atom local_d4 [4];
  View *local_d0;
  View *view_3;
  Group *output_group_3;
  Atom local_b8 [4];
  Atom local_b4 [2];
  uint16_t i_3;
  View *local_b0;
  View *view_2;
  Group *output_group_2;
  long lStack_98;
  uint16_t i_2;
  uint64_t offset;
  View *local_88;
  View *view_1;
  Group *output_group_1;
  Atom local_70 [6];
  uint16_t i_1;
  View *local_60;
  View *view;
  Group *output_group;
  Code *pCStack_48;
  uint16_t i;
  _Fact *copy;
  View *primary_view;
  uint64_t now;
  Group *ref_group;
  Group *origin;
  _Fact *input_fact;
  View *input_local;
  AutoFocusController *this_local;
  
  input_fact = (_Fact *)input;
  input_local = (View *)this;
  origin = (Group *)core::P::operator_cast_to__Fact_((P *)&(input->super_View).object);
  ref_group = View::get_host((View *)input_fact);
  s = 0;
  ppGVar6 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                      (&this->output_groups,0);
  now = (uint64_t)*ppGVar6;
  primary_view = (View *)(*Now)();
  SVar2 = View::get_sync((View *)input_fact);
  switch(SVar2) {
  case SYNC_ONCE:
    for (output_group._6_2_ = 0; uVar7 = (ulong)output_group._6_2_,
        sVar12 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                           (&this->output_groups), uVar7 < sVar12;
        output_group._6_2_ = output_group._6_2_ + 1) {
      ppGVar6 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                          (&this->output_groups,(ulong)output_group._6_2_);
      view = (View *)*ppGVar6;
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,(View *)input_fact,true);
      (pVVar13->super_View).references[0] = (Code *)view;
      (pVVar13->super_View).references[1] =
           (Code *)(input_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.storage_index;
      local_60 = pVVar13;
      r_code::View::code((View *)pVVar13,4);
      fVar16 = (float)r_code::Atom::asFloat();
      uVar3 = Group::get_upr(ref_group);
      uVar4 = Group::get_upr((Group *)view);
      lVar8 = r_code::Utils::GetGroupResilience((double)fVar16,(double)uVar3,(double)uVar4);
      r_code::Atom::Float((float)lVar8);
      pAVar14 = r_code::View::code(&local_60->super_View,4);
      r_code::Atom::operator=(pAVar14,local_70);
      r_code::Atom::~Atom(local_70);
      p_Var15 = _Mem::Get();
      _Mem::inject(p_Var15,local_60);
      if (output_group._6_2_ == 0) {
        copy = (_Fact *)local_60;
      }
    }
    break;
  case SYNC_PERIODIC:
    bVar1 = _Fact::is_anti_fact((_Fact *)origin);
    if (bVar1) {
      pCVar9 = (Code *)AntiFact::operator_new((AntiFact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = Group::get_prev_upr_time((Group *)now,(uint64_t)primary_view);
      uVar11 = Group::get_next_upr_time((Group *)now,(uint64_t)primary_view);
      AntiFact::AntiFact((AntiFact *)pCVar9,(Code *)CONCAT44(extraout_var,iVar5),uVar10,uVar11,1.0,
                         1.0);
      pCStack_48 = pCVar9;
    }
    else {
      pCVar9 = (Code *)Fact::operator_new((Fact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = Group::get_prev_upr_time((Group *)now,(uint64_t)primary_view);
      uVar11 = Group::get_next_upr_time((Group *)now,(uint64_t)primary_view);
      Fact::Fact((Fact *)pCVar9,(Code *)CONCAT44(extraout_var_00,iVar5),uVar10,uVar11,1.0,1.0);
      pCStack_48 = pCVar9;
    }
    for (output_group_1._6_2_ = 0; uVar7 = (ulong)output_group_1._6_2_,
        sVar12 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                           (&this->output_groups), uVar7 < sVar12;
        output_group_1._6_2_ = output_group_1._6_2_ + 1) {
      ppGVar6 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                          (&this->output_groups,(ulong)output_group_1._6_2_);
      view_1 = (View *)*ppGVar6;
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,(View *)input_fact,true);
      (pVVar13->super_View).references[0] = (Code *)view_1;
      (pVVar13->super_View).references[1] =
           (Code *)(input_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.storage_index;
      local_88 = pVVar13;
      r_code::View::code((View *)pVVar13,4);
      fVar16 = (float)r_code::Atom::asFloat();
      uVar3 = Group::get_upr(ref_group);
      uVar4 = Group::get_upr((Group *)view_1);
      lVar8 = r_code::Utils::GetGroupResilience((double)fVar16,(double)uVar3,(double)uVar4);
      r_code::Atom::Float((float)lVar8);
      pAVar14 = r_code::View::code(&local_88->super_View,4);
      r_code::Atom::operator=(pAVar14,(Atom *)((long)&offset + 4));
      r_code::Atom::~Atom((Atom *)((long)&offset + 4));
      core::P<r_code::Code>::operator=(&(local_88->super_View).object,pCStack_48);
      p_Var15 = _Mem::Get();
      _Mem::inject(p_Var15,local_88);
      if ((output_group_1._6_2_ == 0) && (copy = (_Fact *)local_88, (this->_ctpx_on & 1U) != 0)) {
        p_Var15 = _Mem::Get();
        c = (Controller *)operator_new(0xd8);
        PASTController::PASTController((PASTController *)c,this,local_88);
        pVVar13 = view_1;
        uVar3 = Group::get_upr((Group *)view_1);
        lVar8 = r_code::Utils::GetBasePeriod();
        _Mem::inject_null_program(p_Var15,c,(Group *)pVVar13,(ulong)uVar3 * lVar8,true);
      }
    }
    break;
  case SYNC_HOLD:
    lStack_98 = r_code::Utils::GetTimeTolerance();
    lStack_98 = lStack_98 << 1;
    bVar1 = _Fact::is_anti_fact((_Fact *)origin);
    if (bVar1) {
      pCVar9 = (Code *)AntiFact::operator_new((AntiFact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = (long)(primary_view->super_View).references + lStack_98 + -0x10;
      uVar3 = Group::get_upr((Group *)now);
      lVar8 = r_code::Utils::GetBasePeriod();
      AntiFact::AntiFact((AntiFact *)pCVar9,(Code *)CONCAT44(extraout_var_01,iVar5),uVar10,
                         uVar10 + (ulong)uVar3 * lVar8,1.0,1.0);
      pCStack_48 = pCVar9;
    }
    else {
      pCVar9 = (Code *)Fact::operator_new((Fact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = (long)(primary_view->super_View).references + lStack_98 + -0x10;
      uVar3 = Group::get_upr((Group *)now);
      lVar8 = r_code::Utils::GetBasePeriod();
      Fact::Fact((Fact *)pCVar9,(Code *)CONCAT44(extraout_var_02,iVar5),uVar10,
                 uVar10 + (ulong)uVar3 * lVar8,1.0,1.0);
      pCStack_48 = pCVar9;
    }
    for (output_group_2._6_2_ = 0; uVar7 = (ulong)output_group_2._6_2_,
        sVar12 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                           (&this->output_groups), uVar7 < sVar12;
        output_group_2._6_2_ = output_group_2._6_2_ + 1) {
      ppGVar6 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                          (&this->output_groups,(ulong)output_group_2._6_2_);
      view_2 = (View *)*ppGVar6;
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,(View *)input_fact,true);
      (pVVar13->super_View).references[0] = (Code *)view_2;
      (pVVar13->super_View).references[1] =
           (Code *)(input_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.storage_index;
      local_b0 = pVVar13;
      r_code::Atom::Float(0.0);
      pAVar14 = r_code::View::code(&local_b0->super_View,1);
      r_code::Atom::operator=(pAVar14,local_b4);
      r_code::Atom::~Atom(local_b4);
      r_code::View::code(&local_b0->super_View,4);
      fVar16 = (float)r_code::Atom::asFloat();
      uVar3 = Group::get_upr(ref_group);
      uVar4 = Group::get_upr((Group *)view_2);
      lVar8 = r_code::Utils::GetGroupResilience((double)fVar16,(double)uVar3,(double)uVar4);
      r_code::Atom::Float((float)lVar8);
      pAVar14 = r_code::View::code(&local_b0->super_View,4);
      r_code::Atom::operator=(pAVar14,local_b8);
      r_code::Atom::~Atom(local_b8);
      core::P<r_code::Code>::operator=(&(local_b0->super_View).object,pCStack_48);
      p_Var15 = _Mem::Get();
      _Mem::inject(p_Var15,local_b0);
      if ((output_group_2._6_2_ == 0) && (copy = (_Fact *)local_b0, (this->_ctpx_on & 1U) != 0)) {
        p_Var15 = _Mem::Get();
        this_00 = (HASTController *)operator_new(0xe0);
        HASTController::HASTController(this_00,this,local_b0,(_Fact *)origin);
        pVVar13 = view_2;
        uVar3 = Group::get_upr((Group *)view_2);
        lVar8 = r_code::Utils::GetBasePeriod();
        _Mem::inject_null_program
                  (p_Var15,(Controller *)this_00,(Group *)pVVar13,(ulong)uVar3 * lVar8,true);
      }
    }
    break;
  case SYNC_AXIOM:
    bVar1 = _Fact::is_anti_fact((_Fact *)origin);
    if (bVar1) {
      pCVar9 = (Code *)AntiFact::operator_new((AntiFact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = Group::get_prev_upr_time((Group *)now,(uint64_t)primary_view);
      uVar11 = Group::get_next_upr_time((Group *)now,(uint64_t)primary_view);
      AntiFact::AntiFact((AntiFact *)pCVar9,(Code *)CONCAT44(extraout_var_03,iVar5),uVar10,uVar11,
                         1.0,1.0);
      pCStack_48 = pCVar9;
    }
    else {
      pCVar9 = (Code *)Fact::operator_new((Fact *)0x150,s);
      iVar5 = (*(origin->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(origin,0);
      uVar10 = Group::get_prev_upr_time((Group *)now,(uint64_t)primary_view);
      uVar11 = Group::get_next_upr_time((Group *)now,(uint64_t)primary_view);
      Fact::Fact((Fact *)pCVar9,(Code *)CONCAT44(extraout_var_04,iVar5),uVar10,uVar11,1.0,1.0);
      pCStack_48 = pCVar9;
    }
    for (output_group_3._6_2_ = 0; uVar7 = (ulong)output_group_3._6_2_,
        sVar12 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::size
                           (&this->output_groups), uVar7 < sVar12;
        output_group_3._6_2_ = output_group_3._6_2_ + 1) {
      ppGVar6 = std::vector<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>::operator[]
                          (&this->output_groups,(ulong)output_group_3._6_2_);
      view_3 = (View *)*ppGVar6;
      pVVar13 = (View *)operator_new(0x100);
      View::View(pVVar13,(View *)input_fact,true);
      (pVVar13->super_View).references[0] = (Code *)view_3;
      (pVVar13->super_View).references[1] =
           (Code *)(input_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.storage_index;
      local_d0 = pVVar13;
      r_code::Atom::Float(4.0);
      pAVar14 = r_code::View::code(&local_d0->super_View,1);
      r_code::Atom::operator=(pAVar14,local_d4);
      r_code::Atom::~Atom(local_d4);
      r_code::Atom::Float(1.0);
      pAVar14 = r_code::View::code(&local_d0->super_View,4);
      r_code::Atom::operator=(pAVar14,local_d8);
      r_code::Atom::~Atom(local_d8);
      core::P<r_code::Code>::operator=(&(local_d0->super_View).object,pCStack_48);
      p_Var15 = _Mem::Get();
      _Mem::inject(p_Var15,local_d0);
      if (output_group_3._6_2_ == 0) {
        copy = (_Fact *)local_d0;
      }
    }
    break;
  case SYNC_ONCE_AXIOM:
    std::operator<<((ostream *)&std::cerr,"Unhandled sync once axiom");
    exit(1);
  }
  if ((this->_trace_injections & 1U) != 0) {
    std::__cxx11::string::string(local_f8);
    SVar2 = View::get_sync((View *)input_fact);
    switch(SVar2) {
    case SYNC_ONCE:
      std::__cxx11::string::operator=(local_f8,"(once)");
      break;
    case SYNC_PERIODIC:
      std::__cxx11::string::operator=(local_f8,"(periodic)");
      break;
    case SYNC_HOLD:
      std::__cxx11::string::operator=(local_f8,"(hold)");
      break;
    case SYNC_AXIOM:
      std::__cxx11::string::operator=(local_f8,"(axiom)");
      break;
    case SYNC_ONCE_AXIOM:
      std::__cxx11::string::operator=(local_f8,"(once axiom)");
    }
    std::__cxx11::string::~string(local_f8);
  }
  return (View *)copy;
}

Assistant:

inline View *AutoFocusController::inject_input(View *input)
{
    _Fact *input_fact = (_Fact *)input->object;
    Group *origin = input->get_host();
    Group *ref_group = output_groups[0];
    uint64_t now = Now();
    View *primary_view;
    _Fact *copy;

    switch (input->get_sync()) {
    case View::SYNC_ONCE: // no copy, morph res; N.B.: cmds are sync_once.
        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;

    case View::SYNC_PERIODIC: // inject a copy, morph res, add a controller.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new PASTController(this, view), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;

    case View::SYNC_HOLD: { // inject a copy, add a controller, sync_once, morph res, after=now+time_tolerance (de-sync as it can have the same effect as a cmd), before=now+output_grp.upr+time_tolerance.
        uint64_t offset = 2 * Utils::GetTimeTolerance();

        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), now + offset, now + offset + ref_group->get_upr()*Utils::GetBasePeriod(), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE);
            view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;

                if (_ctpx_on) {
                    _Mem::Get()->inject_null_program(new HASTController(this, view, input_fact), output_group, output_group->get_upr()*Utils::GetBasePeriod(), true);
                }
            }
        }

        break;
    }

    case View::SYNC_AXIOM: // inject a copy, sync_once, res=1, fact.before=next output_grp upr.
        if (input_fact->is_anti_fact()) {
            copy = new AntiFact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        } else {
            copy = new Fact(input_fact->get_reference(0), ref_group->get_prev_upr_time(now), ref_group->get_next_upr_time(now), 1, 1);
        }

        for (uint16_t i = 0; i < output_groups.size(); ++i) {
            Group *output_group = output_groups[i];
            View *view = new View(input, true);
            view->references[0] = output_group;
            view->references[1] = input->references[0];
            view->code(VIEW_SYNC) = Atom::Float(View::SYNC_ONCE_AXIOM);
            view->code(VIEW_RES) = Atom::Float(1);
            view->object = copy;
            _Mem::Get()->inject(view);

            if (i == 0) {
                primary_view = view;
            }
        }

        break;
    case View::SYNC_ONCE_AXIOM:
        std::cerr << "Unhandled sync once axiom";
        exit(1);
        break;
    }

    if (_trace_injections) {
        std::string type;

        switch (input->get_sync()) {
        case View::SYNC_HOLD:
            type = "(hold)";
            break;

        case View::SYNC_ONCE:
            type = "(once)";
            break;

        case View::SYNC_PERIODIC:
            type = "(periodic)";
            break;

        case View::SYNC_AXIOM:
            type = "(axiom)";
            break;

        case View::SYNC_ONCE_AXIOM:
            type = "(once axiom)";
            break;
        }

        //    ::debug("auto_focus") << Utils::RelativeTime(Now()) << "A/F ->" << input->object->get_oid() << "|" << primary_view->object->get_oid() << type;
    }

    return primary_view;
}